

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_index.cpp
# Opt level: O2

int main(int argc,char **argv)

{
  Index *pIVar1;
  int iVar2;
  ostream *poVar3;
  allocator local_71;
  Index *index;
  allocator local_68 [32];
  string index_file;
  Options local_28;
  
  poVar3 = std::operator<<((ostream *)&std::cout,"testing kv index...");
  std::endl<char,std::char_traits<char>>(poVar3);
  std::__cxx11::string::string((string *)&index_file,"test.idx",local_68);
  local_28.page_type = kKeyPage;
  local_28.mem_page_size = 0x1000;
  local_28.mem_size = 0x100000;
  local_28.disk_page_size = 0x20000;
  local_28.bloom_filter_bit_per_key = 10;
  iVar2 = kvindex::Index::Open((string *)&index_file,&local_28,&index);
  if (iVar2 == 0) {
    testBasicPutGet(index);
    generateDataFile("test.data");
    pIVar1 = index;
    std::__cxx11::string::string((string *)local_68,"test.data",&local_71);
    (*(code *)**(undefined8 **)pIVar1)(pIVar1,local_68);
    std::__cxx11::string::~string((string *)local_68);
    testMemAndDiskPage(index);
    poVar3 = std::operator<<((ostream *)&std::cout,"success");
    std::endl<char,std::char_traits<char>>(poVar3);
    std::__cxx11::string::~string((string *)&index_file);
    return 0;
  }
  __assert_fail("kvindex::kOk == code",
                "/workspace/llm4binary/github/license_all_cmakelists_25/lxyhcx[P]kv_index/test/test_index.cpp"
                ,0x56,"int main(int, char **)");
}

Assistant:

int main(int argc, char *argv[])
{
    cout << "testing kv index..." << endl;
    string index_file("test.idx");
    kvindex::Index* index;
    kvindex::Options options;
    kvindex::ErrorCode code = kvindex::Index::Open(index_file, options, &index);
    assert(kvindex::kOk == code);

    testBasicPutGet(index);

    generateDataFile("test.data");
    index->LoadDataFrom("test.data");

    // After load data from data file, test get some keys in data file,
    // including keys in mem pages and disk pages.
    testMemAndDiskPage(index);

    cout << "success" << endl;
    return 0;
}